

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap10_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  FT_UInt32 idx;
  FT_UInt32 count;
  FT_UInt32 start;
  FT_Byte *p;
  FT_UInt result;
  FT_Byte *table;
  FT_UInt32 char_code_local;
  TT_CMap cmap_local;
  
  pFVar1 = cmap->data;
  p._4_4_ = 0;
  uVar2 = (uint)pFVar1[0xc] << 0x18 | (uint)pFVar1[0xd] << 0x10 | (uint)pFVar1[0xe] << 8 |
          (uint)pFVar1[0xf];
  if (char_code < uVar2) {
    cmap_local._4_4_ = 0;
  }
  else {
    uVar2 = char_code - uVar2;
    if (uVar2 < ((uint)pFVar1[0x10] << 0x18 | (uint)pFVar1[0x11] << 0x10 | (uint)pFVar1[0x12] << 8 |
                (uint)pFVar1[0x13])) {
      p._4_4_ = (uint)CONCAT11(pFVar1[(ulong)(uVar2 * 2) + 0x14],
                               (pFVar1 + (ulong)(uVar2 * 2) + 0x14)[1]);
    }
    cmap_local._4_4_ = p._4_4_;
  }
  return cmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap10_char_index( TT_CMap    cmap,
                        FT_UInt32  char_code )
  {
    FT_Byte*   table  = cmap->data;
    FT_UInt    result = 0;
    FT_Byte*   p      = table + 12;
    FT_UInt32  start  = TT_NEXT_ULONG( p );
    FT_UInt32  count  = TT_NEXT_ULONG( p );
    FT_UInt32  idx;


    if ( char_code < start )
      return 0;

    idx = char_code - start;

    if ( idx < count )
    {
      p     += 2 * idx;
      result = TT_PEEK_USHORT( p );
    }

    return result;
  }